

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Integer luaL_optinteger(lua_State *L,int idx,lua_Integer def)

{
  int iVar1;
  TValue *pTVar2;
  TValue TVar3;
  TValue tmp;
  
  pTVar2 = index2adr(L,idx);
  TVar3 = (TValue)pTVar2->n;
  if (0xfffffffffffffff1 < (ulong)(TVar3.it64 >> 0x2f)) {
    if ((lua_Number)TVar3.u64 == -NAN) {
      return def;
    }
    if ((TVar3.it64 >> 0x2f != 0xfffffffffffffffb) ||
       (iVar1 = lj_strscan_num((GCstr *)(TVar3.u64 & 0x7fffffffffff),&tmp), TVar3 = tmp, iVar1 == 0)
       ) {
      lj_err_argt(L,idx,3);
    }
  }
  return (long)TVar3.n;
}

Assistant:

LUALIB_API lua_Integer luaL_optinteger(lua_State *L, int idx, lua_Integer def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else if (tvisnil(o)) {
    return def;
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      lj_err_argt(L, idx, LUA_TNUMBER);
    if (tvisint(&tmp))
      return (lua_Integer)intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}